

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O2

void __thiscall FIX::DataDictionary::setVersion(DataDictionary *this,string *beginString)

{
  FieldBase FStack_68;
  
  BeginString::BeginString((BeginString *)&FStack_68,beginString);
  FieldBase::operator=((FieldBase *)&this->m_beginString,&FStack_68);
  FieldBase::~FieldBase(&FStack_68);
  this->m_hasVersion = true;
  return;
}

Assistant:

void setVersion(const std::string &beginString) {
    m_beginString = beginString;
    m_hasVersion = true;
  }